

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

char * my_strdup(char *source)

{
  size_t sVar1;
  char *result;
  char *source_local;
  
  if (source == (char *)0x0) {
    source_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(source);
    source_local = (char *)malloc(sVar1 + 1);
    if (source_local != (char *)0x0) {
      strcpy(source_local,source);
    }
  }
  return source_local;
}

Assistant:

static char * my_strdup(const char * source) {
	if (source == NULL) {
		return NULL;
	}

	char * result = malloc(strlen(source) + 1);

	if (result) {
		strcpy(result, source);
	}

	return result;
}